

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

void ndiCloseSerial(ndicapi *device)

{
  ndicapi *device_local;
  
  ndiSetThreadMode(device,false);
  ndiSerialClose(device->SerialDevice);
  free(device->SerialDeviceName);
  free(device->Command);
  free(device->Reply);
  free(device->ReplyNoCRC);
  device->SerialDeviceName = (char *)0x0;
  device->SerialDevice = -1;
  free(device);
  return;
}

Assistant:

ndicapiExport void ndiCloseSerial(ndicapi* device)
{
  // end the tracking thread if it is running
  ndiSetThreadMode(device, 0);

  // close the serial port
  ndiSerialClose(device->SerialDevice);

  // free the buffers
  free(device->SerialDeviceName);
  free(device->Command);
  free(device->Reply);
  free(device->ReplyNoCRC);
  device->SerialDeviceName = NULL;
  device->SerialDevice = NDI_INVALID_HANDLE;

  free(device);
}